

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O2

ostream * __thiscall nivalis::Environment::to_bin(Environment *this,ostream *os)

{
  pointer pdVar1;
  pointer pUVar2;
  long lVar3;
  size_t i_1;
  size_t i;
  ulong uVar4;
  
  util::write_bin<unsigned_long>
            (os,(long)(this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
  for (uVar4 = 0;
      pdVar1 = (this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar4 = uVar4 + 1) {
    util::write_bin<double>(os,pdVar1[uVar4]);
  }
  util::write_bin<unsigned_long>
            (os,((long)(this->funcs).
                       super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->funcs).
                      super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x58);
  lVar3 = 0x50;
  for (uVar4 = 0;
      pUVar2 = (this->funcs).
               super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(this->funcs).
                             super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) / 0x58);
      uVar4 = uVar4 + 1) {
    Expr::to_bin((Expr *)((long)pUVar2 + lVar3 + -0x30),os);
    util::write_bin<unsigned_long>
              (os,*(unsigned_long *)
                   ((long)&(((this->funcs).
                             super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                             ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                   lVar3));
    lVar3 = lVar3 + 0x58;
  }
  return os;
}

Assistant:

std::ostream& Environment::to_bin(std::ostream& os) const {
    util::write_bin(os, vars.size());
    for (size_t i = 0; i < vars.size(); ++i) {
        util::write_bin(os, vars[i]);
    }
    util::write_bin(os, funcs.size());
    for (size_t i = 0; i < funcs.size(); ++i) {
        funcs[i].expr.to_bin(os);
        util::write_bin(os, funcs[i].n_args);
    }
    return os;
}